

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O3

bool __thiscall Assimp::MD5::MD5Parser::ParseSection(MD5Parser *this,Section *out)

{
  char **out_00;
  byte bVar1;
  iterator __position;
  bool bVar2;
  pointer pEVar3;
  byte *pbVar4;
  byte *pbVar5;
  Element local_58;
  long local_48 [3];
  
  out->iLineNumber = this->lineNumber;
  out_00 = &this->buffer;
  pbVar4 = (byte *)this->buffer;
  while ((0x20 < (ulong)*pbVar4 || ((0x100003601U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0))) {
    pbVar4 = pbVar4 + 1;
    *out_00 = (char *)pbVar4;
  }
  local_58.szStart = (char *)local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58);
  std::__cxx11::string::operator=((string *)&out->mName,(string *)&local_58);
  if ((long *)local_58.szStart != local_48) {
    operator_delete(local_58.szStart,local_48[0] + 1);
  }
  for (pbVar4 = (byte *)*out_00; (*pbVar4 == 0x20 || (*pbVar4 == 9)); pbVar4 = pbVar4 + 1) {
  }
  *out_00 = (char *)pbVar4;
  while( true ) {
    bVar1 = *pbVar4;
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0))
    goto LAB_0043e7ac;
    if (bVar1 == 0x7b) break;
    do {
      do {
        pbVar5 = pbVar4 + 1;
        *out_00 = (char *)pbVar5;
        bVar1 = *pbVar4;
        pbVar4 = pbVar5;
      } while (0x20 < (ulong)bVar1);
    } while ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0);
    local_58.szStart = (char *)local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58);
    std::__cxx11::string::operator=((string *)&out->mGlobalValue,(string *)&local_58);
    if ((long *)local_58.szStart != local_48) {
      operator_delete(local_58.szStart,local_48[0] + 1);
    }
    pbVar4 = (byte *)*out_00;
  }
  this->buffer = (char *)(pbVar4 + 1);
  bVar2 = SkipSpacesAndLineEnd(this,(char *)(pbVar4 + 1),out_00);
  if (bVar2) {
    do {
      if (**out_00 == '}') {
        pbVar4 = (byte *)(*out_00 + 1);
        *out_00 = (char *)pbVar4;
LAB_0043e7ac:
        bVar2 = SkipSpacesAndLineEnd(this,(char *)pbVar4,out_00);
        return bVar2;
      }
      local_58.szStart = (char *)0x0;
      local_58.iLineNumber = 0;
      local_58._12_4_ = 0;
      __position._M_current =
           (out->mElements).
           super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (out->mElements).
          super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>::
        _M_realloc_insert<Assimp::MD5::Element>(&out->mElements,__position,&local_58);
        pEVar3 = (out->mElements).
                 super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        (__position._M_current)->szStart = (char *)0x0;
        *(undefined8 *)&(__position._M_current)->iLineNumber = 0;
        pEVar3 = (out->mElements).
                 super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
        (out->mElements).
        super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>._M_impl.
        super__Vector_impl_data._M_finish = pEVar3;
      }
      pEVar3[-1].iLineNumber = this->lineNumber;
      pbVar4 = (byte *)this->buffer;
      pEVar3[-1].szStart = (char *)pbVar4;
      while (bVar1 = *pbVar4, 1 < bVar1 - 0xc) {
        if (bVar1 == 0) goto LAB_0043e78c;
        if (bVar1 == 10) break;
        pbVar4 = pbVar4 + 1;
        *out_00 = (char *)pbVar4;
      }
      this->lineNumber = this->lineNumber + 1;
      this->buffer = (char *)(pbVar4 + 1);
      *pbVar4 = 0;
      pbVar4 = (byte *)this->buffer;
LAB_0043e78c:
      bVar2 = SkipSpacesAndLineEnd(this,(char *)pbVar4,out_00);
    } while (bVar2);
  }
  return false;
}

Assistant:

bool MD5Parser::ParseSection(Section& out)
{
    // store the current line number for use in error messages
    out.iLineNumber = lineNumber;

    // first parse the name of the section
    char* sz = buffer;
    while (!IsSpaceOrNewLine( *buffer))buffer++;
    out.mName = std::string(sz,(uintptr_t)(buffer-sz));
    SkipSpaces();

    bool running = true;
    while (running) {
        if ('{' == *buffer) {
            // it is a normal section so read all lines
            buffer++;
            bool run = true;
            while (run)
            {
                if (!SkipSpacesAndLineEnd()) {
                    return false; // seems this was the last section
                }
                if ('}' == *buffer) {
                    buffer++;
                    break;
                }

                out.mElements.push_back(Element());
                Element& elem = out.mElements.back();

                elem.iLineNumber = lineNumber;
                elem.szStart = buffer;

                // terminate the line with zero
                while (!IsLineEnd( *buffer))buffer++;
                if (*buffer) {
                    ++lineNumber;
                    *buffer++ = '\0';
                }
            }
            break;
        }
        else if (!IsSpaceOrNewLine(*buffer))    {
            // it is an element at global scope. Parse its value and go on
            sz = buffer;
            while (!IsSpaceOrNewLine( *buffer++));
            out.mGlobalValue = std::string(sz,(uintptr_t)(buffer-sz));
            continue;
        }
        break;
    }
    return SkipSpacesAndLineEnd();
}